

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O1

void __thiscall suisha::t_loop::f_post(t_loop *this,function<void_()> *a_function)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  function<void_()> *p;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)operator_new(0x20);
  *local_18 = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = a_function->_M_invoker;
  p_Var1 = (a_function->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(a_function->super__Function_base)._M_functor + 8);
    *local_18 = *(undefined8 *)&(a_function->super__Function_base)._M_functor;
    local_18[1] = uVar2;
    local_18[2] = p_Var1;
    (a_function->super__Function_base)._M_manager = (_Manager_type)0x0;
    a_function->_M_invoker = (_Invoker_type)0x0;
  }
  write(*(int *)(this + 0x28),&local_18,8);
  return;
}

Assistant:

void f_post(std::function<void()>&& a_function)
	{
		auto p = new std::function<void()>(std::move(a_function));
		write(v_post, &p, sizeof(p));
	}